

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

void __thiscall
kratos::FSM::output(FSM *this,shared_ptr<kratos::Var> *var,shared_ptr<kratos::Var> *default_)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Generator *pGVar3;
  UserException *this_00;
  VarException *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  element_type *local_70;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  string local_50;
  allocator_type local_29;
  
  peVar1 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->generator_->instance_name)._M_dataplus._M_p;
    local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->generator_->instance_name)._M_string_length;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x14;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_(&local_50,(detail *)"var not found in {0}",format_str,args);
    UserException::UserException(this_00,&local_50);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (*(peVar1->super_IRNode)._vptr_IRNode[4])();
  if ((Generator *)CONCAT44(extraout_var,iVar2) != this->generator_) {
    iVar2 = (*(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[4])();
    pGVar3 = (Generator *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x20))
                       ((long *)CONCAT44(extraout_var_00,iVar2));
    if (pGVar3 != this->generator_) {
      this_01 = (VarException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"FSM output has to be scoped inside the top-level of generator"
                 ,"");
      local_70 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_70;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_68,__l,&local_29);
      VarException::VarException(this_01,&local_50,&local_68);
      __cxa_throw(this_01,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_50._M_dataplus._M_p =
       (pointer)(var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(default_->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::
  _Hashtable<kratos::Var*,std::pair<kratos::Var*const,kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<kratos::Var*,kratos::Var*>
            ((_Hashtable<kratos::Var*,std::pair<kratos::Var*const,kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->outputs_);
  return;
}

Assistant:

void FSM::output(const std::shared_ptr<Var>& var, const std::shared_ptr<Var>& default_) {
    if (!var) throw UserException(::format("var not found in {0}", generator_->instance_name));
    // very strict checking of ownership
    if (var->parent() != generator_) {
        if (var->parent()->parent() != generator_)
            throw VarException("FSM output has to be scoped inside the top-level of generator",
                               {var.get()});
    }
    outputs_.emplace(var.get(), default_.get());
}